

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

_Bool monster_can_move(monster_conflict *mon,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster_conflict *mon2;
  monster_conflict *mon1;
  monster_conflict *mon_local;
  loc grid_local;
  
  mon2 = (monster_conflict *)square_monster((chunk *)cave,(loc_conflict)grid);
  if (mon2 == (monster_conflict *)0x0) {
    grid_local.x._3_1_ = true;
  }
  else {
    _Var1 = flag_has_dbg(mon->race->flags,0xc,0x3c,"mon->race->flags","RF_MOVE_BODY");
    if ((_Var1) && (wVar2 = compare_monsters(mon,mon2), L'\0' < wVar2)) {
      grid_local.x._3_1_ = true;
    }
    else {
      grid_local.x._3_1_ = false;
    }
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool monster_can_move(struct monster *mon, struct loc grid)
{
	struct monster *mon1 = square_monster(cave, grid);

	/* No monster */
	if (!mon1) return true;

	if (rf_has(mon->race->flags, RF_MOVE_BODY) &&
		compare_monsters(mon, mon1) > 0) {
		return true;
	}

	return false;
}